

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  ulong *puVar1;
  long lVar2;
  ulong uVar3;
  ctrl_t *pcVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  uint64_t uVar8;
  ulong uVar9;
  size_t hash;
  undefined8 uVar10;
  uint64_t v;
  size_t sVar11;
  ctrl_t cVar12;
  ulong uVar13;
  FindInfo FVar14;
  HashSetResizeHelper resize_helper;
  undefined1 local_52;
  undefined1 local_51;
  HeapOrSoo local_50;
  size_t local_40;
  byte local_38;
  undefined2 local_37;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    local_40 = common->capacity_;
    local_38 = (byte)common->size_ & 1;
    local_37 = 0;
    local_50.heap.control = (common->heap_or_soo_).heap.control;
    local_50.heap.slot_array =
         (MaybeInitializedPtr)((MaybeInitializedPtr *)((long)&common->heap_or_soo_ + 8))->p;
    CommonFields::set_capacity(common,new_capacity);
    bVar7 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,32ul,true,false,8ul>
                      ((HashSetResizeHelper *)&local_50,common,&local_51,0xffffff80,0x10,0x20);
    if ((local_40 != 0) && (!bVar7)) {
      if ((char)local_37 == '\x01') {
        __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x7ea,
                      "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
      }
      if (local_40 != 0) {
        lVar2 = *(long *)((long)&common->heap_or_soo_ + 8);
        sVar11 = 0;
        uVar10 = local_50.heap.slot_array;
        do {
          if ((char)local_37 == '\x01') {
            __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x7e6,
                          "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const")
            ;
          }
          if (kSentinel < local_50.heap.control[sVar11]) {
            uVar3 = *(ulong *)uVar10;
            uVar8 = hash_internal::MixingHashState::CombineContiguousImpl
                              (&hash_internal::MixingHashState::kSeed,*(ulong *)(uVar10 + 8),uVar3);
            uVar13 = (uVar8 ^ uVar3) * -0x234dd359734ecb13;
            FVar14 = find_first_non_full<void>
                               ((container_internal *)common,
                                (CommonFields *)
                                (uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
                                 (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8 |
                                 (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 |
                                 (uVar13 & 0xff00) << 0x28 | uVar13 << 0x38),hash);
            uVar9 = FVar14.offset;
            uVar3 = common->capacity_;
            if (uVar3 <= uVar9) {
              __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x744,
                            "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                           );
            }
            cVar12 = (ctrl_t)(uVar13 >> 0x38) & ~kEmpty;
            pcVar4 = (common->heap_or_soo_).heap.control;
            pcVar4[uVar9] = cVar12;
            pcVar4[(ulong)((uint)uVar3 & 0xf) + (uVar9 - 0xf & uVar3)] = cVar12;
            common->capacity_ = 0xffffffffffffff9c;
            uVar13 = *(ulong *)uVar10;
            uVar5 = *(ulong *)(uVar10 + 8);
            uVar6 = *(ulong *)(uVar10 + 0x18);
            puVar1 = (ulong *)(lVar2 + 0x10 + uVar9 * 0x20);
            *puVar1 = *(ulong *)(uVar10 + 0x10);
            puVar1[1] = uVar6;
            puVar1 = (ulong *)(lVar2 + uVar9 * 0x20);
            *puVar1 = uVar13;
            puVar1[1] = uVar5;
            CommonFields::set_capacity(common,uVar3);
          }
          sVar11 = sVar11 + 1;
          uVar10 = uVar10 + 0x20;
        } while (sVar11 != local_40);
      }
      if ((common->size_ & 1) != 0) {
        CommonFields::backing_array_start(common);
      }
      HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                ((HashSetResizeHelper *)&local_50,&local_52,0x20);
    }
    return;
  }
  __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xe92,
                "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, std::basic_string_view<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string_view<char>, std::basic_string_view<char>>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, std::basic_string_view<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string_view<char>, std::basic_string_view<char>>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }